

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlen.c
# Opt level: O2

int vflen(char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  size_t sVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  ulong uStack_50;
  char *endp;
  
  iVar16 = 0;
  do {
    pcVar14 = fmt;
    if (*fmt != '%') {
      iVar16 = iVar16 + 1;
      if (*fmt == '\0') {
        return iVar16;
      }
      goto switchD_00132126_caseD_62;
    }
LAB_00131fd1:
    fmt = pcVar14 + 1;
    cVar7 = *fmt;
    if (cVar7 == ' ') {
LAB_00131fcc:
      iVar8 = 1;
LAB_00131fce:
      iVar16 = iVar16 + iVar8;
      pcVar14 = fmt;
      goto LAB_00131fd1;
    }
    iVar8 = 2;
    if (cVar7 == '#') goto LAB_00131fce;
    if ((cVar7 == '-') || (cVar7 == '+')) goto LAB_00131fcc;
    uVar2 = strtol(fmt,&endp,10);
    pcVar15 = endp;
    if (fmt == endp) {
      cVar7 = *fmt;
      if (cVar7 == '*') {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar4 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          piVar4 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar4 + 2;
        }
        uVar2 = (ulong)*piVar4;
        pcVar15 = pcVar14 + 2;
        goto LAB_0013204c;
      }
      uVar2 = 0;
    }
    else {
LAB_0013204c:
      cVar7 = *pcVar15;
      fmt = pcVar15;
    }
    if (cVar7 == '.') {
      pcVar14 = fmt + 1;
      uVar3 = strtol(pcVar14,&endp,10);
      pcVar15 = endp;
      if ((endp == pcVar14) && (pcVar15 = pcVar14, *pcVar14 == '*')) {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar4 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          piVar4 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar4 + 2;
        }
        uVar3 = (ulong)*piVar4;
        pcVar15 = fmt + 2;
      }
      fmt = pcVar15;
      uVar6 = uVar3;
      if ((long)uVar3 < (long)uVar2) {
        uVar6 = uVar2;
      }
      cVar7 = *fmt;
    }
    else {
      uVar3 = 0;
      uVar6 = uVar2;
    }
    lVar12 = 1;
    if (cVar7 == 'h') {
LAB_001320f1:
      cVar7 = fmt[lVar12];
      fmt = fmt + lVar12;
    }
    else if (cVar7 == 'l') {
      cVar7 = fmt[1];
      lVar12 = 2;
      if (cVar7 == 'l') goto LAB_001320f1;
      fmt = fmt + 1;
    }
    switch(cVar7) {
    case 'a':
    case 'd':
    case 'i':
    case 'u':
    case 'x':
switchD_00132126_caseD_61:
      if (ap->gp_offset < 0x29) {
        ap->gp_offset = ap->gp_offset + 8;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
      bVar18 = SBORROW8(uVar6,0x18);
      bVar17 = (long)(uVar6 - 0x18) < 0;
      uStack_50 = 0x17;
      goto LAB_001322ef;
    case 'b':
    case 'h':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'q':
    case 'r':
    case 't':
    case 'v':
    case 'w':
      break;
    case 'c':
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar4 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        piVar4 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar4 + 2;
      }
      iVar8 = *piVar4;
      if (iVar8 < 0x80) {
        iVar9 = (int)uVar2 + (uint)(uVar2 == 0);
      }
      else {
        sVar5 = __ctype_get_mb_cur_max();
        uVar6 = 1;
        if (sVar5 < uVar2) {
          uVar6 = uVar2;
        }
        iVar9 = (int)uVar6;
        if ((0x7f < iVar8) && (uVar2 <= sVar5)) {
          sVar5 = __ctype_get_mb_cur_max();
          iVar9 = (int)sVar5;
        }
      }
      iVar16 = iVar16 + iVar9;
      break;
    case 'e':
    case 'g':
switchD_00132126_caseD_65:
      if (ap->fp_offset < 0xa1) {
        ap->fp_offset = ap->fp_offset + 0x10;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
      bVar18 = SBORROW8(uVar6,0xe);
      bVar17 = (long)(uVar6 - 0xe) < 0;
      uStack_50 = 0xd;
      goto LAB_001322ef;
    case 'f':
      uVar1 = ap->fp_offset;
      if ((ulong)uVar1 < 0xa1) {
        pdVar11 = (double *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->fp_offset = uVar1 + 0x10;
      }
      else {
        pdVar11 = (double *)ap->overflow_arg_area;
        ap->overflow_arg_area = pdVar11 + 1;
      }
      dVar19 = *pdVar11;
      if (dVar19 <= -dVar19) {
        dVar19 = -dVar19;
      }
      lVar12 = 0xf;
      if (1000000.0 < dVar19) {
        lVar12 = 0x13d;
      }
      lVar13 = uVar2 + 2;
      if ((long)(uVar2 + 2) < lVar12) {
        lVar13 = lVar12;
      }
      iVar8 = (int)lVar13;
      iVar9 = (int)uVar3 + -6;
      if (uVar3 == 0) {
        iVar9 = 0;
      }
      iVar16 = iVar16 + iVar9;
LAB_001322df:
      iVar16 = iVar16 + iVar8;
      break;
    case 'p':
      if (ap->gp_offset < 0x29) {
        ap->gp_offset = ap->gp_offset + 8;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
      bVar18 = SBORROW8(uVar6,0x15);
      bVar17 = (long)(uVar6 - 0x15) < 0;
      uStack_50 = 0x14;
LAB_001322ef:
      if (bVar18 != bVar17) {
        uVar6 = uStack_50;
      }
LAB_001322f4:
      iVar16 = iVar16 + (int)uVar6;
      break;
    case 's':
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar10 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        puVar10 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar10 + 1;
      }
      if (uVar3 == 0) {
        sVar5 = strlen((char *)*puVar10);
        if ((long)uVar6 <= (long)(int)sVar5) {
          uVar6 = (long)(int)sVar5;
        }
      }
      goto LAB_001322f4;
    default:
      if (cVar7 == 'X') goto switchD_00132126_caseD_61;
      if ((cVar7 == 'E') || (cVar7 == 'G')) goto switchD_00132126_caseD_65;
      if (cVar7 == '%') {
        if ((long)uVar2 < 2) {
          uVar2 = 1;
        }
        iVar8 = (int)uVar2;
        goto LAB_001322df;
      }
    }
switchD_00132126_caseD_62:
    fmt = fmt + 1;
  } while( true );
}

Assistant:

int vflen(char *fmt, va_list ap)
{
    int len = 0;
    char *cp, c;
    long long l;
    int i;
    double d; 

    /*
     * This code modifies 'ap', but we do not know if va_list is a structure
     * or a pointer to an array so we do not know if it is a local variable
     * or not.
     * C99 gets around this by defining va_copy() to make copies of ap, but
     * this does not exist on all systems.
     * For now, I just assume that when va_list is a pointer the system also
     * provides a va_copy macro to work around this problem. The only system
     * I have seen needing this so far was Linux on AMD64.
     */
#if defined(HAVE_VA_COPY)
    va_list ap_local;
    va_copy(ap_local, ap);
#    define ap ap_local
#endif

    for(cp = fmt; *cp; cp++) {
	switch(*cp) {

	/* A format specifier */
	case '%': {
	    char *endp;
	    long conv_len1=0, conv_len2=0, conv_len=0;
	    signed int arg_size;

	    /* Firstly, strip the modifier flags (+-#0 and [space]) */
	    for(; (c=*++cp);) {
		if ('#' == c)
		    len+=2; /* Worst case of "0x" */
		else if ('-' == c || '+' == c || ' ' == c)
		    len++;
		else
		    break;
	    }

	    /* Width specifier */
	    l = strtol(cp, &endp, 10);
	    if (endp != cp) {
		cp = endp;
		conv_len = conv_len1 = l;
	    } else if (*cp == '*') {
		conv_len = conv_len1 = (int)va_arg(ap, int);
		cp++;
	    }

	    /* Precision specifier */
	    if ('.' == *cp) {
		cp++;
		conv_len2 = strtol(cp, &endp, 10);
		if (endp != cp) {
		    cp = endp;
		} else if (*cp == '*') {
		    conv_len2 = (int)va_arg(ap, int);
		    cp++;
		}
		conv_len = MAX(conv_len1, conv_len2);
	    }

	    /* Short/long identifier */
	    if ('h' == *cp) {
		arg_size = -1; /* short */
		cp++;
	    } else if ('l' == *cp) {
		arg_size = 1; /* long */
		cp++;
		if ('l' == *cp) {
		    arg_size = 2; /* long long */
		    cp++;
		}
	    } else {
		arg_size = 0; /* int */
	    }

	    /* The actual type */
	    switch (*cp) {
	    case '%':
		/*
		 * Not real ANSI I suspect, but we'll allow for the
		 * completely daft "%10%" example.
		 */
		len += MAX(conv_len1, 1);
		break;

	    case 'd':
	    case 'i':
	    case 'u':
	    case 'a':
	    case 'x':
	    case 'X':
		/* Remember: char and short are sent as int on the stack */
		if (arg_size == -1)
		    l = (long)va_arg(ap, int);
		else if (arg_size == 1)
		    l = va_arg(ap, long); 
		else if (arg_size == 2)
		    l = va_arg(ap, long long); 
		else 
		    l = (long)va_arg(ap, int);

		DEBUG_printf("%d", l);

		/*
		 * No number can be more than 24 characters so we'll take
		 * the max of conv_len and 24 (23 is len(2^64) in octal).
		 * All that work above and we then go and estimate ;-),
		 * but it's needed incase someone does %500d.
		 */
		len += MAX(conv_len, 23);
		break;

	    case 'c':
		i = va_arg(ap, int);
		DEBUG_printf("%c", i);
		/*
		 * Note that %10c and %.10c act differently.
		 * Besides, I think precision is not really allowed for %c.
		 */
		len += MAX(conv_len1, i>=0x80 ?MB_CUR_MAX :1);
		break;

	    case 'f':
		d = va_arg(ap, double);
		DEBUG_printf("%f", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that.
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double. The worst case I can
		 * think of is 317 characters (-1[308 zeros].000000)
		 * without using precision codes. That's horrid. I
		 * cheat and either use 317 or 15 depending on how
		 * large the number is as I reckon 99% of floats
		 * aren't that long.
		 */
		l = (ABS(d) > 1000000) ? 317 : 15;
		l = MAX(l, conv_len1 + 2);
		if (conv_len2) l += conv_len2 - 6;
		len += l;
		break;

	    case 'e':
	    case 'E':
	    case 'g':
	    case 'G':
		d = va_arg(ap, double);
		DEBUG_printf("%g", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double (which defaults to only
		 * '-' + 6 + '.' + 'E[+-]xxx' == 13.
		 */
		len += MAX(conv_len, 13);
		break;

	    case 'p':
		l = (long)va_arg(ap, void *);
		/*
		 * Max pointer is 64bits == 16 chars (on alpha),
		 * == 20 with + "0x".
		 */
		DEBUG_printf("%p", (void *)l);
		len += MAX(conv_len, 20);
		break;

	    case 'n':
		/* produces no output */
		break;

	    case 's': {
		char *s = (char *)va_arg(ap, char *);
		DEBUG_printf("%s", s);

		if (!conv_len2) {
		    len += MAX(conv_len, (int)strlen(s));
		} else {
		    len += conv_len;
		}
		break;
	    }

	    default:
		/* wchar_t types of 'C' and 'S' aren't supported */
		DEBUG_printf("Arg is %c\n", *cp);
	    }
	    
	}

	case '\0':
	    break;

	default:
	    DEBUG_printf("%c", *cp);
	    len++;
	}
    }

    va_end(ap);

    return len+1; /* one for the null character */
}